

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

int ON_Solve3x3(double *row0,double *row1,double *row2,double d0,double d1,double d2,double *x_addr,
               double *y_addr,double *z_addr,double *pivot_ratio)

{
  byte bVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  char cVar7;
  char cVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double local_c8;
  
  cVar8 = '\0';
  iVar2 = 0;
  *z_addr = 0.0;
  *y_addr = 0.0;
  *x_addr = 0.0;
  *pivot_ratio = 0.0;
  dVar11 = *row0;
  dVar14 = row0[1];
  dVar28 = ABS(dVar11);
  dVar23 = ABS(dVar14);
  cVar7 = dVar28 < dVar23;
  if (dVar23 <= dVar28) {
    dVar23 = dVar28;
  }
  dVar28 = row0[2];
  if (dVar23 < ABS(dVar28)) {
    cVar7 = '\x02';
    dVar23 = ABS(dVar28);
  }
  dVar30 = *row1;
  dVar22 = ABS(dVar30);
  if (dVar23 < dVar22) {
    cVar7 = cVar8;
  }
  dVar13 = row1[1];
  dVar27 = dVar22;
  if (dVar22 <= dVar23) {
    dVar27 = dVar23;
  }
  dVar19 = ABS(dVar13);
  dVar24 = dVar27;
  if (dVar27 < dVar19) {
    cVar7 = '\x01';
    dVar24 = dVar19;
  }
  dVar18 = row1[2];
  dVar26 = ABS(dVar18);
  dVar9 = dVar24;
  if (dVar24 < dVar26) {
    cVar7 = '\x02';
    dVar9 = dVar26;
  }
  dVar21 = *row2;
  dVar17 = ABS(dVar21);
  dVar15 = dVar17;
  if (dVar17 <= dVar9) {
    dVar15 = dVar9;
    cVar8 = cVar7;
  }
  dVar12 = row2[1];
  dVar16 = ABS(dVar12);
  dVar25 = dVar15;
  if (dVar15 < dVar16) {
    cVar8 = '\x01';
    dVar25 = dVar16;
  }
  dVar29 = row2[2];
  dVar20 = ABS(dVar29);
  dVar10 = dVar25;
  if (dVar25 < dVar20) {
    cVar8 = '\x02';
    dVar10 = dVar20;
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    bVar1 = (-(dVar23 < dVar22) | -(dVar27 < dVar19)) & 1U | dVar24 < dVar26;
    if (dVar25 < dVar20) {
      bVar1 = 2;
    }
    if (dVar15 < dVar16) {
      bVar1 = 2;
    }
    if (dVar9 < dVar17) {
      bVar1 = 2;
    }
    dVar23 = dVar18;
    dVar22 = dVar28;
    dVar27 = dVar14;
    dVar24 = dVar30;
    dVar19 = d0;
    dVar9 = d1;
    dVar26 = dVar11;
    local_c8 = d2;
    if ((bVar1 != 1) &&
       (dVar23 = dVar28, dVar22 = dVar18, dVar27 = dVar13, dVar24 = dVar11, dVar19 = d1, dVar9 = d0,
       dVar13 = dVar14, dVar26 = dVar30, bVar1 == 2)) {
      dVar23 = dVar29;
      dVar24 = dVar21;
      dVar29 = dVar28;
      dVar21 = dVar11;
      dVar9 = d2;
      dVar13 = dVar12;
      dVar12 = dVar14;
      local_c8 = d0;
    }
    pdVar3 = y_addr;
    pdVar5 = x_addr;
    pdVar6 = z_addr;
    dVar11 = dVar26;
    dVar14 = dVar29;
    dVar28 = dVar13;
    dVar30 = dVar21;
    dVar18 = dVar24;
    if ((cVar8 != '\x02') &&
       (pdVar5 = z_addr, pdVar6 = x_addr, dVar11 = dVar22, dVar14 = dVar21, dVar22 = dVar26,
       dVar30 = dVar29, dVar18 = dVar23, dVar23 = dVar24, cVar8 == '\x01')) {
      pdVar3 = x_addr;
      pdVar6 = y_addr;
      dVar14 = dVar12;
      dVar22 = dVar27;
      dVar28 = dVar24;
      dVar27 = dVar26;
      dVar12 = dVar21;
      dVar23 = dVar13;
    }
    dVar23 = 1.0 / dVar23;
    dVar28 = dVar28 * dVar23;
    dVar18 = dVar18 * dVar23;
    dVar23 = dVar23 * dVar9;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      dVar27 = dVar27 - dVar22 * dVar28;
      dVar11 = dVar11 - dVar22 * dVar18;
      dVar19 = dVar19 - dVar22 * dVar23;
    }
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      dVar12 = dVar12 - dVar14 * dVar28;
      dVar30 = dVar30 - dVar14 * dVar18;
      local_c8 = local_c8 - dVar14 * dVar23;
    }
    dVar22 = ABS(dVar27);
    dVar13 = ABS(dVar11);
    dVar14 = dVar13;
    if (dVar13 <= dVar22) {
      dVar14 = dVar22;
    }
    dVar9 = ABS(dVar12);
    dVar24 = dVar9;
    if (dVar9 <= dVar14) {
      dVar24 = dVar14;
    }
    dVar21 = ABS(dVar30);
    dVar26 = dVar21;
    if (dVar21 <= dVar24) {
      dVar26 = dVar24;
    }
    iVar2 = 1;
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      dVar10 = ABS(dVar10);
      dVar15 = dVar26;
      if ((dVar10 < dVar26) || (dVar15 = dVar10, dVar10 <= dVar26)) {
        dVar26 = dVar10;
      }
      pdVar4 = pdVar5;
      dVar17 = dVar27;
      dVar25 = dVar30;
      dVar16 = dVar28;
      if (dVar22 < dVar13 && dVar9 <= dVar14 || dVar24 < dVar21) {
        pdVar4 = pdVar3;
        pdVar3 = pdVar5;
        dVar17 = dVar11;
        dVar11 = dVar27;
        dVar25 = dVar12;
        dVar12 = dVar30;
        dVar16 = dVar18;
        dVar18 = dVar28;
      }
      dVar28 = dVar12;
      if (dVar9 <= dVar14 && dVar21 <= dVar24) {
        dVar28 = dVar17;
      }
      dVar28 = 1.0 / dVar28;
      dVar30 = dVar25;
      if (dVar9 <= dVar14 && dVar21 <= dVar24) {
        dVar30 = dVar11;
      }
      dVar30 = dVar30 * dVar28;
      if (dVar9 <= dVar14 && dVar21 <= dVar24) {
        dVar28 = dVar28 * dVar19;
        dVar11 = dVar30;
        dVar19 = dVar28;
        dVar22 = dVar25;
      }
      else {
        dVar28 = dVar28 * local_c8;
        dVar25 = dVar30;
        dVar22 = dVar11;
        local_c8 = dVar28;
      }
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        dVar18 = dVar18 - dVar16 * dVar30;
        dVar23 = dVar23 - dVar28 * dVar16;
      }
      if (dVar9 <= dVar14 && dVar21 <= dVar24) {
        dVar17 = dVar12;
      }
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        dVar22 = dVar22 - dVar30 * dVar17;
        if (dVar9 <= dVar14 && dVar21 <= dVar24) {
          local_c8 = local_c8 + -dVar17 * dVar19;
          dVar25 = dVar22;
        }
        else {
          dVar19 = dVar19 + -dVar17 * local_c8;
          dVar11 = dVar22;
        }
      }
      iVar2 = 2;
      if ((dVar22 != 0.0) || (NAN(dVar22))) {
        dVar28 = ABS(dVar22);
        dVar30 = dVar28;
        if ((dVar15 < dVar28) || (dVar30 = dVar15, dVar26 <= dVar28)) {
          dVar28 = dVar26;
          dVar15 = dVar30;
        }
        dVar30 = dVar19;
        if (dVar9 <= dVar14 && dVar21 <= dVar24) {
          dVar30 = local_c8;
        }
        dVar30 = dVar30 / dVar22;
        if (dVar9 <= dVar14 && dVar21 <= dVar24) {
          if ((dVar11 != 0.0) || (local_c8 = dVar19, NAN(dVar11))) {
            local_c8 = dVar19 - dVar11 * dVar30;
          }
        }
        else if ((dVar25 != 0.0) || (NAN(dVar25))) {
          local_c8 = local_c8 - dVar25 * dVar30;
        }
        *pdVar6 = (double)(~-(ulong)(dVar18 != 0.0) & (ulong)dVar23 |
                          (ulong)(dVar23 - dVar18 * dVar30) & -(ulong)(dVar18 != 0.0));
        *pdVar3 = local_c8;
        *pdVar4 = dVar30;
        *pivot_ratio = dVar28 / dVar15;
        iVar2 = 3;
      }
    }
  }
  return iVar2;
}

Assistant:

int
ON_Solve3x3(const double row0[3], const double row1[3], const double row2[3],
                double d0, double d1, double d2,
                double* x_addr, double* y_addr, double* z_addr,
                double* pivot_ratio)
{
  /* Solve a 3x3 linear system using Gauss-Jordan elimination 
   * with full pivoting.
   */
  int i, j;
  double* p0;
  double* p1;
  double* p2;
  double x, y, workarray[12], maxpiv, minpiv;

  const int sizeof_row = 3*sizeof(row0[0]);

  *pivot_ratio = *x_addr = *y_addr = *z_addr = 0.0;
  x = fabs(row0[0]); i=j=0;
  y = fabs(row0[1]); if (y>x) {x=y;j=1;}
  y = fabs(row0[2]); if (y>x) {x=y;j=2;}
  y = fabs(row1[0]); if (y>x) {x=y;i=1;j=0;}
  y = fabs(row1[1]); if (y>x) {x=y;i=1;j=1;}
  y = fabs(row1[2]); if (y>x) {x=y;i=1;j=2;}
  y = fabs(row2[0]); if (y>x) {x=y;i=2;j=0;}
  y = fabs(row2[1]); if (y>x) {x=y;i=2;j=1;}
  y = fabs(row2[2]); if (y>x) {x=y;i=2;j=2;}
  if (x == 0.0) 
    return 0;
  maxpiv = minpiv = fabs(x);
  p0 = workarray;
  switch(i) {
  case 1: /* swap rows 0 and 1 */
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  case 2: /* swap rows 0 and 2 */
    memcpy(p0,row2,sizeof_row); p0[3] = d2; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row0,sizeof_row); p0[3] = d0;
    break;
  default:
    memcpy(p0,row0,sizeof_row); p0[3] = d0; p0 += 4;
    memcpy(p0,row1,sizeof_row); p0[3] = d1; p0 += 4;
    memcpy(p0,row2,sizeof_row); p0[3] = d2;
    break;
  }
  switch(j) {
  case 1: /* swap columns 0 and 1 */
    p0 = x_addr; x_addr = y_addr; y_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[1]; p0[1]=x;
    break;
  case 2: /* swap columns 0 and 2 */
    p0 = x_addr; x_addr = z_addr; z_addr = p0;
    p0 = &workarray[0]; 
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x; p0 += 4;
    x = p0[0]; p0[0]=p0[2]; p0[2]=x;
    break;
  }

  x = 1.0/workarray[0];
  /* debugger set workarray[0] = 1 */
  p0 = p1 = workarray + 1;
  *p1++ *= x; *p1++ *= x; *p1++ *= x;
  x = -(*p1++);
  /* debugger set workarray[4] = 0 */
  if (x == 0.0) 
    p1 += 3;
  else 
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}
  x = -(*p1++);
  /* debugger set workarray[8] = 0 */
  if (x != 0.0)
    {*p1++ += x*(*p0++); *p1++ += x*(*p0++); *p1++ += x*(*p0); p0 -= 2;}

  x = fabs(workarray[ 5]);i=j=0;
  y = fabs(workarray[ 6]);if (y>x) {x=y;j=1;}
  y = fabs(workarray[ 9]);if (y>x) {x=y;i=1;j=0;}
  y = fabs(workarray[10]);if (y>x) {x=y;i=j=1;}
  if (x == 0.0) 
    return 1; // rank = 1;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  if (j) {
    /* swap columns 1 and 2 */
    p0 = workarray+1;
    p1 = p0+1;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    x = *p0; *p0 = *p1; *p1 = x; p0 += 4; p1 += 4;
    p0 = y_addr; y_addr = z_addr; z_addr = p0;
  }

  if (i) {
    /* pivot is in row 2 */
    p0 = workarray+1;
    p1 = p0 + 8;
    p2 = p0 + 4;
  }
  else {
    /* pivot is in row 1 */
    p0 = workarray+1;
    p1 = p0 + 4;
    p2 = p0 + 8;
  }

  /* debugger set workarray[5+4*i] = 1 */
  x = 1.0/(*p1++); *p1++ *= x; *p1 *= x; p1--;
  x = -(*p0++);
  /* debugger set p0[-1] = 0 */
  if (x != 0.0) {*p0++ += x*(*p1++); *p0 += x*(*p1); p0--; p1--;}
  x = -(*p2++);
  /* debugger set p2[-1] = 0 */
  if (x != 0.0) {*p2++ += x*(*p1++); *p2 += x*(*p1); p2--; p1--;}
  x = *p2++;
  if (x == 0.0) 
    return 2; // rank = 2;
  y = fabs(x);
  if (y > maxpiv) maxpiv = y; else if (y < minpiv) minpiv = y;
  /* debugger set p2[-1] = 1 */
  *p2 /= x;
  x = -(*p1++);  if (x != 0.0) *p1 += x*(*p2);
  /* debugger set p1[-1] = 0 */
  x = -(*p0++);  if (x != 0.0) *p0 += x*(*p2);
  /* debugger set p0[-1] = 0 */
  *x_addr = workarray[3];
  if (i) {
    *y_addr = workarray[11];
    *z_addr = workarray[7];
  }
  else {
    *y_addr = workarray[7];
    *z_addr = workarray[11];
  }
  *pivot_ratio = minpiv/maxpiv;
  return 3;
}